

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

int __thiscall libtorrent::aux::session_impl::init(session_impl *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  service_type *psVar2;
  ulong uVar3;
  int extraout_EAX;
  long *plVar4;
  wait_op *op;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  ptr local_58;
  session_impl *local_40;
  allocator<void> local_38 [4];
  uint local_34;
  
  uVar7 = 0;
  session_log(this," *** session thread init");
  local_40 = (session_impl *)this->m_io_context;
  local_34 = 1;
  plVar4 = (long *)__tls_get_addr(&PTR_004eaf08);
  if (*plVar4 != 0) {
    uVar7 = *(undefined8 *)(*plVar4 + 8);
  }
  local_58.a = local_38;
  local_58.v = boost::asio::detail::thread_info_base::
               allocate<boost::asio::detail::thread_info_base::default_tag>(uVar7,0x28);
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_58.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_58.v)->super_scheduler_operation).func_ =
       boost::asio::detail::
       executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_58.v)->super_scheduler_operation).task_result_ = 0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_58.v)->handler_).this = this;
  local_58.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_58.v;
  boost::asio::detail::scheduler::post_immediate_completion
            (*(scheduler **)&local_40->super_dht_observer,(operation *)local_58.v,
             SUB41((local_34 & 2) >> 1,0));
  local_58.v = (void *)0x0;
  local_58.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)0x0;
  boost::asio::detail::
  executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  ::ptr::reset(&local_58);
  local_58.a = (allocator<void> *)&(this->m_settings).m_mutex;
  local_58.v = (void *)((ulong)local_58.v & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_58);
  local_58.v = (void *)CONCAT71(local_58.v._1_7_,1);
  iVar1 = (this->m_settings).m_store.m_ints._M_elems[0x43];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_58);
  iVar5 = (int)((ulong)((long)(this->m_torrents).m_array.
                              super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_torrents).m_array.
                             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (iVar5 < 2) {
    iVar5 = 1;
  }
  uVar3 = (long)iVar1 / (long)iVar5;
  uVar6 = 1;
  if (1 < (int)uVar3) {
    uVar6 = uVar3 & 0xffffffff;
  }
  local_58.a = (allocator<void> *)(uVar6 * 1000000000);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->m_lsd_announce_timer,(duration *)&local_58);
  local_58.a = (allocator<void> *)&local_40;
  psVar2 = (this->m_lsd_announce_timer).impl_.service_;
  if (*plVar4 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(undefined8 *)(*plVar4 + 8);
  }
  local_40 = this;
  op = (wait_op *)
       boost::asio::detail::thread_info_base::
       allocate<boost::asio::detail::thread_info_base::default_tag>(uVar7,0x60);
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:707:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  (op->ec_).val_ = 0;
  (op->ec_).failed_ = false;
  (op->ec_).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  op[1].super_operation.next_ = (scheduler_operation *)local_40;
  local_58.v = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)&op[1].super_operation.func_,&(this->m_lsd_announce_timer).impl_.executor_)
  ;
  (this->m_lsd_announce_timer).impl_.implementation_.might_have_pending_waits = true;
  local_58.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)op;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
            (psVar2->scheduler_,&psVar2->timer_queue_,
             &(this->m_lsd_announce_timer).impl_.implementation_.expiry,
             &(this->m_lsd_announce_timer).impl_.implementation_.timer_data,op);
  local_58.v = (void *)0x0;
  local_58.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:699:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:707:35),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)&local_58);
  session_log(this," done starting session");
  recalculate_unchoke_slots(this);
  run_all_updates(this);
  reopen_listen_sockets(this,false);
  return extraout_EAX;
}

Assistant:

void session_impl::init()
	{
		// this is a debug facility
		// see single_threaded in debug.hpp
		thread_started();

		TORRENT_ASSERT(is_single_thread());

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** session thread init");
#endif

		// this is where we should set up all async operations. This
		// is called from within the network thread as opposed to the
		// constructor which is called from the main thread

#if defined TORRENT_ASIO_DEBUGGING
		async_inc_threads();
		add_outstanding_async("session_impl::on_tick");
#endif
		post(m_io_context, [this]{ wrap(&session_impl::on_tick, error_code()); });

		int const lsd_announce_interval
			= m_settings.get_int(settings_pack::local_service_announce_interval);
		int const delay = std::max(lsd_announce_interval
			/ std::max(static_cast<int>(m_torrents.size()), 1), 1);
		m_lsd_announce_timer.expires_after(seconds(delay));
		ADD_OUTSTANDING_ASYNC("session_impl::on_lsd_announce");
		m_lsd_announce_timer.async_wait([this](error_code const& e) {
			wrap(&session_impl::on_lsd_announce, e); } );

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" done starting session");
#endif

		// this applies unchoke settings from m_settings
		recalculate_unchoke_slots();

		// apply all m_settings to this session
		run_all_updates(*this);
		reopen_listen_sockets(false);

#if TORRENT_USE_INVARIANT_CHECKS
		check_invariant();
#endif
	}